

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master.cpp
# Opt level: O3

RpcValue __thiscall
miniros::master::Master::getParamNames(Master *this,string *caller_id,Connection *param_2)

{
  pointer pcVar1;
  XmlRpcValue *pXVar2;
  anon_union_8_8_d5adaace_for__value extraout_RDX;
  pointer pbVar3;
  int i;
  RpcValue RVar4;
  RpcValue response;
  string s;
  XmlRpcValue local_88;
  string local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  XmlRpcValue local_40;
  
  XmlRpc::XmlRpcValue::Array((XmlRpcValue *)this,3);
  local_78._M_dataplus._M_p._0_4_ = 1;
  pXVar2 = XmlRpc::XmlRpcValue::operator[]((XmlRpcValue *)this,0);
  XmlRpc::XmlRpcValue::operator=(pXVar2,(int *)&local_78);
  pXVar2 = XmlRpc::XmlRpcValue::operator[]((XmlRpcValue *)this,1);
  XmlRpc::XmlRpcValue::operator=(pXVar2,"getParamNames");
  local_88._type = TypeInvalid;
  local_88._value.asDouble = 0.0;
  ParameterStorage::getParamNames
            (&local_58,(ParameterStorage *)(caller_id + 0x1d),(string *)param_2);
  if (local_58.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_58.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    i = 0;
    pbVar3 = local_58.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      pcVar1 = (pbVar3->_M_dataplus)._M_p;
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_78,pcVar1,pcVar1 + pbVar3->_M_string_length);
      XmlRpc::XmlRpcValue::XmlRpcValue(&local_40,&local_78);
      pXVar2 = XmlRpc::XmlRpcValue::operator[](&local_88,i);
      XmlRpc::XmlRpcValue::operator=(pXVar2,&local_40);
      XmlRpc::XmlRpcValue::invalidate(&local_40);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      pbVar3 = pbVar3 + 1;
      i = i + 1;
    } while (pbVar3 != local_58.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_58);
  pXVar2 = XmlRpc::XmlRpcValue::operator[]((XmlRpcValue *)this,2);
  XmlRpc::XmlRpcValue::operator=(pXVar2,&local_88);
  XmlRpc::XmlRpcValue::invalidate(&local_88);
  RVar4._value.asDouble = extraout_RDX.asDouble;
  RVar4._0_8_ = this;
  return RVar4;
}

Assistant:

Master::RpcValue Master::getParamNames(const std::string& caller_id, Connection*)
{
  RpcValue res = RpcValue::Array(3);
  res[0] = 1;
  res[1] = "getParamNames";

  RpcValue response;
  int index = 0;
  for (std::string s : m_parameterStorage.getParamNames(caller_id)) {
    response[index++] = s;
  }

  res[2] = response;
  return res;
}